

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_memory.cpp
# Opt level: O0

void __thiscall LiteScript::_BasicMemory_0::Remove(_BasicMemory_0 *this,uint id)

{
  value_type_conflict1 vVar1;
  reference pvVar2;
  Object *__p;
  uint id_local;
  _BasicMemory_0 *this_local;
  
  pvVar2 = std::array<short,_256UL>::operator[](&this->free,(ulong)id);
  if (*pvVar2 == -1) {
    vVar1 = this->first_free;
    pvVar2 = std::array<short,_256UL>::operator[](&this->free,(ulong)id);
    *pvVar2 = vVar1;
    this->first_free = (short)id;
    __p = operator[](this,id);
    __gnu_cxx::new_allocator<LiteScript::Object>::destroy<LiteScript::Object>
              ((new_allocator<LiteScript::Object> *)&this->field_0x2e08,__p);
    this->count = this->count - 1;
  }
  return;
}

Assistant:

void LiteScript::_BasicMemory_0::Remove(unsigned int id) {
    if (this->free[id] != -1)
        return;
    this->free[id] = this->first_free;
    this->first_free = (short)id;
    this->allocator.destroy(&(*this)[id]);
    this->count--;
}